

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void generateCards(card *cards)

{
  pointer pcVar1;
  int iVar2;
  card *this;
  string *psVar3;
  pointer *__ptr;
  ulong uVar4;
  unique_ptr<card,_std::default_delete<card>_> temp;
  char *local_d0;
  uint local_c8;
  char local_c0 [48];
  undefined1 local_90 [16];
  undefined1 local_80 [32];
  undefined1 local_60 [48];
  
  this = (card *)operator_new(0x30);
  card::card(this);
  psVar3 = (string *)&cards->name;
  uVar4 = 0;
  do {
    iVar2 = (int)uVar4;
    if (6 < uVar4) {
      this->value = 1;
      (*(code *)(&DAT_00108030 + *(int *)(&DAT_00108030 + (ulong)(iVar2 - 7) * 4)))
                (local_60,local_90,&DAT_00108030,local_80);
      return;
    }
    this->value = iVar2 + 1;
    local_d0 = local_c0;
    std::__cxx11::string::_M_construct((ulong)&local_d0,'\x01');
    std::__detail::__to_chars_10_impl<unsigned_int>(local_d0,local_c8,iVar2 + 1);
    std::__cxx11::string::operator=((string *)&this->name,(string *)&local_d0);
    if (local_d0 != local_c0) {
      operator_delete(local_d0);
    }
    *(uint *)(psVar3 + -8) = this->value;
    *(undefined8 *)(psVar3 + -0x10) = *(undefined8 *)this;
    std::__cxx11::string::_M_assign(psVar3);
    uVar4 = uVar4 + 1;
    psVar3 = psVar3 + 0x30;
  } while (uVar4 != 0xb);
  if (this != (card *)0x0) {
    pcVar1 = (this->name)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(this->name).field_2) {
      operator_delete(pcVar1);
    }
    operator_delete(this);
  }
  return;
}

Assistant:

void generateCards(card cards[]) {
    unique_ptr<card> temp(new card);
    for (unsigned int i = 0; i < CARD_TYPES; i++) {
        // numbered cards 1-7
        if (i < 7) {
            temp->setValue(i + 1);
            temp->setName(to_string(i + 1));
        }
        // special cards
        else {
            temp->setValue(1); // can be used to check if a card is numbered or special
            switch (i) {
                case 7:
                    temp->setName("bolt");
                    temp->setCardType(1);
                    break;
                case 8:
                    temp->setName("mirror");
                    temp->setCardType(2);
                    break;
                case 9:
                    temp->setName("blast");
                    temp->setCardType(3);
                    break;
                case 10:
                    temp->setName("force");
                    temp->setCardType(4);
                    break;
                default:
                    cout << "An error has occurred. " << "cards cannot be generated";
                    break;
            }
        }
        cards[i] = *temp;
    }
}